

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_fast_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int originalSize)

{
  char *pcVar1;
  ushort uVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  LZ4_byte *pLVar6;
  ushort *puVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  char *__dest;
  ushort *local_68;
  long local_60;
  long local_58;
  LZ4_streamDecode_t *local_50;
  char *local_48;
  LZ4_byte *local_40;
  size_t local_38;
  
  sVar4 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (sVar4 == 0) {
    iVar3 = LZ4_decompress_fast(source,dest,originalSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (LZ4_byte *)dest) {
      local_38 = (LZ4_streamDecode->internal_donotuse).extDictSize;
      local_40 = (LZ4_streamDecode->internal_donotuse).externalDict + local_38;
      local_58 = (long)originalSize;
      pcVar1 = dest + local_58;
      local_60 = (long)dest - sVar4;
      local_68 = (ushort *)source;
      local_50 = LZ4_streamDecode;
      local_48 = source;
      do {
        puVar7 = (ushort *)((long)local_68 + 1);
        uVar2 = *local_68;
        uVar9 = (uint)(byte)((byte)uVar2 >> 4);
        uVar10 = (ulong)uVar9;
        local_68 = puVar7;
        if (uVar9 == 0xf) {
          sVar4 = read_long_length_no_check((BYTE **)&local_68);
          uVar10 = sVar4 + 0xf;
        }
        puVar7 = local_68;
        if ((ulong)((long)pcVar1 - (long)dest) < uVar10) {
          return -1;
        }
        memmove(dest,local_68,uVar10);
        __dest = dest + uVar10;
        puVar7 = (ushort *)((long)puVar7 + uVar10);
        if ((ulong)((long)pcVar1 - (long)__dest) < 0xc) {
          if (__dest != pcVar1) {
            return -1;
          }
          local_48._0_4_ = (int)puVar7 - (int)local_48;
          if (0 < (int)local_48) {
            (local_50->internal_donotuse).prefixSize =
                 (local_50->internal_donotuse).prefixSize + local_58;
            (local_50->internal_donotuse).prefixEnd =
                 (local_50->internal_donotuse).prefixEnd + local_58;
            return (int)local_48;
          }
          return (int)local_48;
        }
        uVar10 = (ulong)((byte)uVar2 & 0xf);
        uVar11 = (ulong)*puVar7;
        local_68 = puVar7 + 1;
        if (uVar10 == 0xf) {
          sVar4 = read_long_length_no_check((BYTE **)&local_68);
          uVar10 = sVar4 + 0xf;
        }
        uVar10 = uVar10 + 4;
        if ((ulong)((long)pcVar1 - (long)__dest) < uVar10) {
          return -1;
        }
        uVar8 = (long)__dest - local_60;
        if (local_38 + uVar8 < uVar11) {
          return -1;
        }
        if (uVar8 < uVar11) {
          pLVar6 = local_40 + (uVar8 - uVar11);
          uVar11 = (long)local_40 - (long)pLVar6;
          if (uVar10 < uVar11) {
            memmove(__dest,pLVar6,uVar10);
            uVar11 = uVar10;
            uVar10 = 0;
          }
          else {
            memmove(__dest,pLVar6,uVar11);
            uVar10 = uVar10 - uVar11;
          }
          __dest = __dest + uVar11;
          lVar5 = local_60;
        }
        else {
          lVar5 = (long)__dest - uVar11;
        }
        for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
          __dest[uVar11] = *(char *)(lVar5 + uVar11);
        }
        dest = __dest + uVar10;
      } while (4 < (ulong)((long)pcVar1 - (long)dest));
      return -1;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = sVar4;
    pLVar6 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -sVar4;
    (LZ4_streamDecode->internal_donotuse).externalDict = pLVar6;
    iVar3 = LZ4_decompress_fast_extDict(source,dest,originalSize,pLVar6,sVar4);
  }
  if (0 < iVar3) {
    (LZ4_streamDecode->internal_donotuse).prefixSize = (long)originalSize;
    (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + originalSize);
  }
  return iVar3;
}

Assistant:

LZ4_FORCE_O2 int
LZ4_decompress_fast_continue (LZ4_streamDecode_t* LZ4_streamDecode,
                        const char* source, char* dest, int originalSize)
{
    LZ4_streamDecode_t_internal* const lz4sd =
        (assert(LZ4_streamDecode!=NULL), &LZ4_streamDecode->internal_donotuse);
    int result;

    DEBUGLOG(5, "LZ4_decompress_fast_continue (toDecodeSize=%i)", originalSize);
    assert(originalSize >= 0);

    if (lz4sd->prefixSize == 0) {
        DEBUGLOG(5, "first invocation : no prefix nor extDict");
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_fast(source, dest, originalSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd = (BYTE*)dest + originalSize;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        DEBUGLOG(5, "continue using existing prefix");
        result = LZ4_decompress_unsafe_generic(
                        (const BYTE*)source, (BYTE*)dest, originalSize,
                        lz4sd->prefixSize,
                        lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)originalSize;
        lz4sd->prefixEnd  += originalSize;
    } else {
        DEBUGLOG(5, "prefix becomes extDict");
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_fast_extDict(source, dest, originalSize,
                                             lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd  = (BYTE*)dest + originalSize;
    }

    return result;
}